

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-unix.c++
# Opt level: O2

bool __thiscall kj::UnixEventPort::processEpollEvents(UnixEventPort *this,epoll_event *events,int n)

{
  anon_union_4_1_a8c68091_for_NullableValue<kj::OwnFd>_2 __fd;
  FdObserver *this_00;
  bool bVar1;
  int iVar2;
  ssize_t sVar3;
  TimePoint newTime;
  ulong uVar4;
  ulong uVar5;
  bool _kjCondition;
  Fault f;
  uint64_t value;
  undefined8 uStack_40;
  ulong local_38;
  undefined4 extraout_var;
  
  uVar5 = 0;
  uVar4 = (ulong)(uint)n;
  if (n < 1) {
    uVar4 = uVar5;
  }
  bVar1 = false;
  local_38 = uVar4;
  do {
    if (uVar5 == uVar4) {
      newTime.value.value._0_4_ = (**this->clock->_vptr_MonotonicClock)();
      newTime.value.value._4_4_ = extraout_var;
      TimerImpl::advanceTo(&this->timerImpl,newTime);
      return bVar1;
    }
    this_00 = (FdObserver *)events[uVar5].data.ptr;
    if (this_00 == (FdObserver *)0x1) {
      if ((this->timerFd).ptr.isSet == false) {
        kj::_::Debug::Fault::Fault
                  ((Fault *)&value,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix.c++"
                   ,0x28d,FAILED,"timerFd != nullptr","");
        kj::_::Debug::Fault::fatal((Fault *)&value);
      }
      __fd = (this->timerFd).ptr.field_1;
      value = 0;
      uStack_40 = 0;
      do {
        sVar3 = read((int)__fd,&value,0x10);
        if (-1 < sVar3) goto LAB_003664cb;
        iVar2 = kj::_::Debug::getOsErrorNumber(true);
      } while (iVar2 == -1);
      if (iVar2 != 0) {
        kj::_::Debug::Fault::Fault
                  (&f,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix.c++"
                   ,0x290,iVar2,"n = read(tfd, buffer, sizeof(buffer))","");
        kj::_::Debug::Fault::fatal(&f);
      }
LAB_003664cb:
      _kjCondition = sVar3 == 8 || sVar3 < 0;
      if (sVar3 != 8 && sVar3 >= 0) {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,bool&>
                  (&f,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix.c++"
                   ,0x291,FAILED,"n == 8 || n < 0","_kjCondition,",&_kjCondition);
        kj::_::Debug::Fault::fatal(&f);
      }
      this->timerfdIsArmed = false;
      uVar4 = local_38;
    }
    else if (this_00 == (FdObserver *)0x0) {
      do {
        sVar3 = read((this->eventFd).fd,&value,8);
        if (-1 < sVar3) goto LAB_00366463;
        iVar2 = kj::_::Debug::getOsErrorNumber(true);
      } while (iVar2 == -1);
      if (iVar2 != 0) {
        kj::_::Debug::Fault::Fault
                  (&f,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix.c++"
                   ,0x286,iVar2,"n = read(eventFd, &value, sizeof(value))","");
        kj::_::Debug::Fault::fatal(&f);
      }
LAB_00366463:
      _kjCondition = sVar3 == 8 || sVar3 < 0;
      if (sVar3 != 8 && sVar3 >= 0) {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,bool&>
                  (&f,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix.c++"
                   ,0x287,FAILED,"n < 0 || n == sizeof(value)","_kjCondition,",&_kjCondition);
        kj::_::Debug::Fault::fatal(&f);
      }
      bVar1 = true;
    }
    else {
      FdObserver::fire(this_00,(short)events[uVar5].events);
    }
    uVar5 = uVar5 + 1;
  } while( true );
}

Assistant:

bool UnixEventPort::processEpollEvents(struct epoll_event events[], int n) {
  bool woken = false;

  for (int i = 0; i < n; i++) {
    if (events[i].data.u64 == 0) {
      // Someone called wake() from another thread. Consume the event.
      uint64_t value;
      ssize_t n;
      KJ_NONBLOCKING_SYSCALL(n = read(eventFd, &value, sizeof(value)));
      KJ_ASSERT(n < 0 || n == sizeof(value));

      // We were woken. Need to return true.
      woken = true;
    } else if (events[i].data.u64 == 1) {
      // timerfd fired. We need to clear it by reading it.
      int tfd = KJ_ASSERT_NONNULL(timerFd).get();
      char buffer[16]{};
      ssize_t n;
      KJ_NONBLOCKING_SYSCALL(n = read(tfd, buffer, sizeof(buffer)));
      KJ_ASSERT(n == 8 || n < 0);

      timerfdIsArmed = false;

      // The purpose of this event is just to wake up the event loop when needed. We'll check the
      // timer queue separately, so we don't need to do anything special in response to this event
      // here.
    } else {
      FdObserver* observer = reinterpret_cast<FdObserver*>(events[i].data.ptr);
      observer->fire(events[i].events);
    }
  }

  timerImpl.advanceTo(clock.now());

  return woken;
}